

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.cc
# Opt level: O2

DVector * fizplex::operator*(DVector *__return_storage_ptr__,double c,DVector *vec)

{
  double dVar1;
  size_t d;
  size_t *psVar2;
  double *pdVar3;
  size_t i;
  size_t i_00;
  
  psVar2 = DVector::dimension(vec);
  d = *psVar2;
  DVector::DVector(__return_storage_ptr__,d);
  for (i_00 = 0; d != i_00; i_00 = i_00 + 1) {
    pdVar3 = DVector::operator[](vec,i_00);
    dVar1 = *pdVar3;
    pdVar3 = DVector::operator[](__return_storage_ptr__,i_00);
    *pdVar3 = dVar1 * c;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector operator*(const double c, const DVector &vec) {
  size_t dim = vec.dimension();
  DVector result(dim);
  for (size_t i = 0; i < dim; i++)
    result[i] = c * vec[i];
  return result;
}